

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_anydata_equal(lyd_node *first,lyd_node *second)

{
  LYS_NODE LVar1;
  uint uVar2;
  hash_table *phVar3;
  hash_table *s2;
  char *__assertion;
  hash_table *local_30;
  char *str2;
  char *str1;
  
  str2 = (char *)0x0;
  local_30 = (hash_table *)0x0;
  LVar1 = first->schema->nodetype;
  if ((LVar1 & LYS_ANYDATA) == LYS_UNKNOWN) {
    __assertion = "first->schema->nodetype & LYS_ANYDATA";
    uVar2 = 0x36;
  }
  else {
    if (LVar1 == second->schema->nodetype) {
      phVar3 = first->ht;
      if (phVar3 == (hash_table *)0x0) {
        lyxml_print_mem(&str2,(lyxml_elem *)0x0,0x10);
        phVar3 = (hash_table *)lydict_insert_zc(first->schema->module->ctx,str2);
        first->ht = phVar3;
      }
      s2 = second->ht;
      str2 = (char *)phVar3;
      if (s2 == (hash_table *)0x0) {
        lyxml_print_mem((char **)&local_30,(lyxml_elem *)0x0,0x10);
        s2 = (hash_table *)lydict_insert_zc(second->schema->module->ctx,(char *)local_30);
        second->ht = s2;
      }
      if (first->schema->module->ctx == second->schema->module->ctx) {
        uVar2 = (uint)((hash_table *)str2 == s2);
      }
      else {
        local_30 = s2;
        uVar2 = ly_strequal_(str2,(char *)s2);
      }
      return uVar2;
    }
    __assertion = "first->schema->nodetype == second->schema->nodetype";
    uVar2 = 0x37;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,uVar2,"int lyd_anydata_equal(struct lyd_node *, struct lyd_node *)");
}

Assistant:

static int
lyd_anydata_equal(struct lyd_node *first, struct lyd_node *second)
{
    char *str1 = NULL, *str2 = NULL;
    struct lyd_node_anydata *anydata;

    assert(first->schema->nodetype & LYS_ANYDATA);
    assert(first->schema->nodetype == second->schema->nodetype);

    anydata = (struct lyd_node_anydata *)first;
    if (!anydata->value.str) {
        lyxml_print_mem(&str1, anydata->value.xml, LYXML_PRINT_SIBLINGS);
        anydata->value.str = lydict_insert_zc(anydata->schema->module->ctx, str1);
    }
    str1 = (char *)anydata->value.str;

    anydata = (struct lyd_node_anydata *)second;
    if (!anydata->value.str) {
        lyxml_print_mem(&str2, anydata->value.xml, LYXML_PRINT_SIBLINGS);
        anydata->value.str = lydict_insert_zc(anydata->schema->module->ctx, str2);
    }
    str2 = (char *)anydata->value.str;

    if (first->schema->module->ctx != second->schema->module->ctx) {
        return ly_strequal(str1, str2, 0);
    } else {
        return ly_strequal(str1, str2, 1);
    }
}